

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O1

void ApprovalTests::SystemUtils::ensureParentDirectoryExists(string *fullFilePath)

{
  bool bVar1;
  string parentDirectory;
  string local_28;
  
  FileUtils::getDirectory(&local_28,fullFilePath);
  if (local_28._M_string_length != 0) {
    bVar1 = FileUtils::fileExists(&local_28);
    if (!bVar1) {
      makeDirectoryForNonWindows(&local_28);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SystemUtils::ensureParentDirectoryExists(const std::string& fullFilePath)
    {
        const std::string parentDirectory = FileUtils::getDirectory(fullFilePath);
        if (!parentDirectory.empty())
        {
            SystemUtils::ensureDirectoryExists(parentDirectory);
        }
    }